

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O1

bool __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,StructBegin sb,Range *input)

{
  bool bVar1;
  void *pvVar2;
  void *__buf;
  
  comma(this);
  if ((this->_pp != (PrettyPrinter *)0x0) &&
     (bVar1 = PrettyPrinter::printStruct(this->_pp,this->_out,sb,input), bVar1)) {
    return true;
  }
  pvVar2 = (void *)0x0;
  __buf = pvVar2;
  if (sb.name._len != 0) {
    do {
      __buf = pvVar2;
      if (sb.name._ptr[(long)pvVar2] == '<') break;
      pvVar2 = (void *)((long)pvVar2 + 1);
      __buf = (void *)sb.name._len;
    } while ((void *)sb.name._len != pvVar2);
  }
  pvVar2 = __buf;
  if (sb.name._len < __buf) {
    pvVar2 = (void *)sb.name._len;
  }
  detail::OstreamBuffer::write(this->_out,(int)sb.name._ptr,__buf,(size_t)pvVar2);
  if (sb.tag._len == 0) {
    this->_emptyStruct = true;
  }
  else {
    detail::OstreamBuffer::write(this->_out,0x10d90a,(void *)0x2,(size_t)pvVar2);
    this->_state = SeqBegin;
    this->_seqDepth = this->_seqDepth + 1;
  }
  return false;
}

Assistant:

bool ToStringVisitor::visit(mserialize::Visitor::StructBegin sb, Range& input)
{
  comma();

  if (_pp != nullptr && _pp->printStruct(_out, sb, input))
  {
    return true;
  }

  _out << mserialize::detail::remove_prefix_before(sb.name, '<');
  if (sb.tag.empty())
  {
    _emptyStruct = true;
  }
  else
  {
    _out << "{ ";
    enterSeq();
  }

  return false;
}